

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.h
# Opt level: O0

dim_t lf::base::internal::DimensionImpl(RefElType type)

{
  runtime_error *this;
  dim_t local_c;
  RefElType type_local;
  
  if (type == kPoint) {
    local_c = 0;
  }
  else if (type == kSegment) {
    local_c = 1;
  }
  else {
    if (1 < (byte)(type - kTria)) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,"RefEl::Dimension() not implemented for this RefEl type.");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_c = 2;
  }
  return local_c;
}

Assistant:

constexpr dim_t DimensionImpl(RefElType type) {
  switch (type) {
    case RefElType::kPoint:
      return 0;
    case RefElType::kSegment:
      return 1;
    case RefElType::kTria:
    case RefElType::kQuad:
      return 2;
    default:
      throw std::runtime_error(
          "RefEl::Dimension() not implemented for this RefEl type.");
  }
}